

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst_sse4.c
# Opt level: O0

void acc_stat_highbd_win7_one_line_sse4_1
               (uint16_t *dgd,uint16_t *src,int h_start,int h_end,int dgd_stride,__m128i *shuffle,
               int32_t *sumX,int32_t (*sumY) [7],int64_t (*M_int) [7],int64_t (*H_int) [56])

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  long lVar5;
  long lVar6;
  uint in_ECX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  __m128i dgd_ijkl_1;
  long in_stack_00000010;
  long in_stack_00000018;
  uint16_t D1_1;
  int64_t *H__1;
  uint16_t *dgd_ijk_1;
  uint16_t *dgd_ij_1;
  uint16_t X1_1;
  __m128i dgd_ijkl;
  uint16_t D2;
  uint16_t D1;
  int64_t *H_;
  uint16_t *dgd_ijk;
  uint16_t *dgd_ij;
  uint16_t X2;
  uint16_t X1;
  int has_odd_pixel;
  int h_end_even;
  int wiener_win;
  int l;
  int k;
  int j;
  undefined4 local_84;
  undefined4 local_80;
  undefined4 local_7c;
  int32_t in_stack_ffffffffffffffd0;
  int32_t in_stack_ffffffffffffffd4;
  __m128i *in_stack_ffffffffffffffd8;
  __m128i *shuffle_00;
  uint16_t *in_stack_ffffffffffffffe0;
  uint16_t *dgd_00;
  int64_t *in_stack_ffffffffffffffe8;
  
  for (local_7c = in_EDX; local_7c < (int)(in_ECX & 0xfffffffe); local_7c = local_7c + 2) {
    uVar1 = *(ushort *)(in_RSI + (long)local_7c * 2);
    uVar2 = *(ushort *)(in_RSI + (long)(local_7c + 1) * 2);
    *(uint *)dgd_ijkl_1[1] = (uint)uVar1 + (uint)uVar2 + *(int *)dgd_ijkl_1[1];
    for (local_80 = 0; local_80 < 7; local_80 = local_80 + 1) {
      lVar5 = in_RDI + (long)local_7c * 2 + (long)(local_80 * in_R8D) * 2;
      for (local_84 = 0; local_84 < 7; local_84 = local_84 + 1) {
        uVar3 = *(ushort *)(lVar5 + (long)local_84 * 2);
        uVar4 = *(ushort *)(lVar5 + 2 + (long)local_84 * 2);
        lVar6 = in_stack_00000010 + (long)local_80 * 0x1c;
        *(uint *)(lVar6 + (long)local_84 * 4) =
             *(int *)(lVar6 + (long)local_84 * 4) + (uint)uVar3 + (uint)uVar4;
        lVar6 = in_stack_00000018 + (long)local_80 * 0x38;
        *(long *)(lVar6 + (long)local_84 * 8) =
             *(long *)(lVar6 + (long)local_84 * 8) +
             (long)(int)((uint)uVar3 * (uint)uVar1 + (uint)uVar4 * (uint)uVar2);
        in_stack_ffffffffffffffd0 = loadu_int32((void *)(lVar5 + (long)local_84 * 2));
        in_stack_ffffffffffffffd4 = in_stack_ffffffffffffffd0;
        acc_stat_highbd_sse41
                  (in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
                   (__m128i *)CONCAT44(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffd0));
        acc_stat_highbd_sse41
                  (in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
                   (__m128i *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
        acc_stat_highbd_sse41
                  (in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
                   (__m128i *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
        acc_stat_highbd_sse41
                  (in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
                   (__m128i *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
        acc_stat_highbd_sse41
                  (in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
                   (__m128i *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
        acc_stat_highbd_sse41
                  (in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
                   (__m128i *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
        acc_stat_highbd_sse41
                  (in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
                   (__m128i *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
      }
    }
  }
  if ((in_ECX & 1) != 0) {
    uVar1 = *(ushort *)(in_RSI + (long)local_7c * 2);
    *(uint *)dgd_ijkl_1[1] = (uint)uVar1 + *(int *)dgd_ijkl_1[1];
    for (local_80 = 0; local_80 < 7; local_80 = local_80 + 1) {
      for (local_84 = 0; local_84 < 7; local_84 = local_84 + 1) {
        uVar2 = *(ushort *)
                 (in_RDI + (long)local_7c * 2 + (long)(local_80 * in_R8D) * 2 + (long)local_84 * 2);
        lVar5 = in_stack_00000010 + (long)local_80 * 0x1c;
        *(uint *)(lVar5 + (long)local_84 * 4) = *(int *)(lVar5 + (long)local_84 * 4) + (uint)uVar2;
        lVar5 = in_stack_00000018 + (long)local_80 * 0x38;
        *(long *)(lVar5 + (long)local_84 * 8) =
             *(long *)(lVar5 + (long)local_84 * 8) + (long)(int)((uint)uVar2 * (uint)uVar1);
        shuffle_00 = (__m128i *)(ulong)CONCAT24(uVar2,(uint)uVar2);
        dgd_00 = (uint16_t *)(ulong)CONCAT24(uVar2,(uint)uVar2);
        acc_stat_highbd_sse41
                  (in_stack_ffffffffffffffe8,dgd_00,shuffle_00,
                   (__m128i *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
        acc_stat_highbd_sse41
                  (in_stack_ffffffffffffffe8,dgd_00,shuffle_00,
                   (__m128i *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
        acc_stat_highbd_sse41
                  (in_stack_ffffffffffffffe8,dgd_00,shuffle_00,
                   (__m128i *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
        acc_stat_highbd_sse41
                  (in_stack_ffffffffffffffe8,dgd_00,shuffle_00,
                   (__m128i *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
        acc_stat_highbd_sse41
                  (in_stack_ffffffffffffffe8,dgd_00,shuffle_00,
                   (__m128i *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
        acc_stat_highbd_sse41
                  (in_stack_ffffffffffffffe8,dgd_00,shuffle_00,
                   (__m128i *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
        acc_stat_highbd_sse41
                  (in_stack_ffffffffffffffe8,dgd_00,shuffle_00,
                   (__m128i *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
      }
    }
  }
  return;
}

Assistant:

static inline void acc_stat_highbd_win7_one_line_sse4_1(
    const uint16_t *dgd, const uint16_t *src, int h_start, int h_end,
    int dgd_stride, const __m128i *shuffle, int32_t *sumX,
    int32_t sumY[WIENER_WIN][WIENER_WIN], int64_t M_int[WIENER_WIN][WIENER_WIN],
    int64_t H_int[WIENER_WIN2][WIENER_WIN * 8]) {
  int j, k, l;
  const int wiener_win = WIENER_WIN;
  // Main loop handles two pixels at a time
  // We can assume that h_start is even, since it will always be aligned to
  // a tile edge + some number of restoration units, and both of those will
  // be 64-pixel aligned.
  // However, at the edge of the image, h_end may be odd, so we need to handle
  // that case correctly.
  assert(h_start % 2 == 0);
  const int h_end_even = h_end & ~1;
  const int has_odd_pixel = h_end & 1;
  for (j = h_start; j < h_end_even; j += 2) {
    const uint16_t X1 = src[j];
    const uint16_t X2 = src[j + 1];
    *sumX += X1 + X2;
    const uint16_t *dgd_ij = dgd + j;
    for (k = 0; k < wiener_win; k++) {
      const uint16_t *dgd_ijk = dgd_ij + k * dgd_stride;
      for (l = 0; l < wiener_win; l++) {
        int64_t *H_ = &H_int[(l * wiener_win + k)][0];
        const uint16_t D1 = dgd_ijk[l];
        const uint16_t D2 = dgd_ijk[l + 1];
        sumY[k][l] += D1 + D2;
        M_int[k][l] += D1 * X1 + D2 * X2;

        // Load two u16 values from dgd as a single u32
        // Then broadcast to 4x u32 slots of a 128
        const __m128i dgd_ijkl = _mm_set1_epi32(loadu_int32(dgd_ijk + l));
        // dgd_ijkl = [y x y x y x y x] as u16

        acc_stat_highbd_sse41(H_ + 0 * 8, dgd_ij + 0 * dgd_stride, shuffle,
                              &dgd_ijkl);
        acc_stat_highbd_sse41(H_ + 1 * 8, dgd_ij + 1 * dgd_stride, shuffle,
                              &dgd_ijkl);
        acc_stat_highbd_sse41(H_ + 2 * 8, dgd_ij + 2 * dgd_stride, shuffle,
                              &dgd_ijkl);
        acc_stat_highbd_sse41(H_ + 3 * 8, dgd_ij + 3 * dgd_stride, shuffle,
                              &dgd_ijkl);
        acc_stat_highbd_sse41(H_ + 4 * 8, dgd_ij + 4 * dgd_stride, shuffle,
                              &dgd_ijkl);
        acc_stat_highbd_sse41(H_ + 5 * 8, dgd_ij + 5 * dgd_stride, shuffle,
                              &dgd_ijkl);
        acc_stat_highbd_sse41(H_ + 6 * 8, dgd_ij + 6 * dgd_stride, shuffle,
                              &dgd_ijkl);
      }
    }
  }
  // If the width is odd, add in the final pixel
  if (has_odd_pixel) {
    const uint16_t X1 = src[j];
    *sumX += X1;
    const uint16_t *dgd_ij = dgd + j;
    for (k = 0; k < wiener_win; k++) {
      const uint16_t *dgd_ijk = dgd_ij + k * dgd_stride;
      for (l = 0; l < wiener_win; l++) {
        int64_t *H_ = &H_int[(l * wiener_win + k)][0];
        const uint16_t D1 = dgd_ijk[l];
        sumY[k][l] += D1;
        M_int[k][l] += D1 * X1;

        // The `acc_stat_highbd_sse41` function wants its input to have
        // interleaved copies of two pixels, but we only have one. However, the
        // pixels are (effectively) used as inputs to a multiply-accumulate. So
        // if we set the extra pixel slot to 0, then it is effectively ignored.
        const __m128i dgd_ijkl = _mm_set1_epi32((int)D1);

        acc_stat_highbd_sse41(H_ + 0 * 8, dgd_ij + 0 * dgd_stride, shuffle,
                              &dgd_ijkl);
        acc_stat_highbd_sse41(H_ + 1 * 8, dgd_ij + 1 * dgd_stride, shuffle,
                              &dgd_ijkl);
        acc_stat_highbd_sse41(H_ + 2 * 8, dgd_ij + 2 * dgd_stride, shuffle,
                              &dgd_ijkl);
        acc_stat_highbd_sse41(H_ + 3 * 8, dgd_ij + 3 * dgd_stride, shuffle,
                              &dgd_ijkl);
        acc_stat_highbd_sse41(H_ + 4 * 8, dgd_ij + 4 * dgd_stride, shuffle,
                              &dgd_ijkl);
        acc_stat_highbd_sse41(H_ + 5 * 8, dgd_ij + 5 * dgd_stride, shuffle,
                              &dgd_ijkl);
        acc_stat_highbd_sse41(H_ + 6 * 8, dgd_ij + 6 * dgd_stride, shuffle,
                              &dgd_ijkl);
      }
    }
  }
}